

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_add_filter_b64encode.c
# Opt level: O2

wchar_t archive_filter_b64encode_write(archive_write_filter *f,void *buff,size_t length)

{
  uchar uVar1;
  void *pvVar2;
  ulong uVar3;
  ulong length_00;
  wchar_t wVar4;
  
  wVar4 = L'\0';
  if (length != 0) {
    pvVar2 = f->data;
    uVar3 = *(ulong *)((long)pvVar2 + 0x40);
    if (uVar3 != 0) {
      while( true ) {
        if ((0x38 < uVar3) || (length == 0)) break;
        uVar1 = *buff;
        buff = (void *)((long)buff + 1);
        *(ulong *)((long)pvVar2 + 0x40) = uVar3 + 1;
        *(uchar *)((long)pvVar2 + uVar3 + 0x48) = uVar1;
        uVar3 = *(ulong *)((long)pvVar2 + 0x40);
        length = length - 1;
      }
      if (uVar3 < 0x39) {
        return L'\0';
      }
      b64_encode((archive_string *)((long)pvVar2 + 0x20),(uchar *)((long)pvVar2 + 0x48),0x39);
      *(undefined8 *)((long)pvVar2 + 0x40) = 0;
    }
    for (; 0x38 < length; length = length - 0x39) {
      b64_encode((archive_string *)((long)pvVar2 + 0x20),(uchar *)buff,0x39);
      buff = (void *)((long)buff + 0x39);
    }
    if (length != 0) {
      memcpy((void *)((long)pvVar2 + 0x48),buff,length);
      *(size_t *)((long)pvVar2 + 0x40) = length;
    }
    uVar3 = *(ulong *)((long)pvVar2 + 0x28);
    length_00 = *(ulong *)((long)pvVar2 + 0x38);
    wVar4 = L'\0';
    while (length_00 <= uVar3) {
      wVar4 = __archive_write_filter(f->next_filter,*(void **)((long)pvVar2 + 0x20),length_00);
      memmove(*(void **)((long)pvVar2 + 0x20),
              (void *)((long)*(void **)((long)pvVar2 + 0x20) + *(long *)((long)pvVar2 + 0x38)),
              *(long *)((long)pvVar2 + 0x28) - *(long *)((long)pvVar2 + 0x38));
      length_00 = *(ulong *)((long)pvVar2 + 0x38);
      uVar3 = *(long *)((long)pvVar2 + 0x28) - length_00;
      *(ulong *)((long)pvVar2 + 0x28) = uVar3;
    }
  }
  return wVar4;
}

Assistant:

static int
archive_filter_b64encode_write(struct archive_write_filter *f, const void *buff,
    size_t length)
{
	struct private_b64encode *state = (struct private_b64encode *)f->data;
	const unsigned char *p = buff;
	int ret = ARCHIVE_OK;

	if (length == 0)
		return (ret);

	if (state->hold_len) {
		while (state->hold_len < LBYTES && length > 0) {
			state->hold[state->hold_len++] = *p++;
			length--;
		}
		if (state->hold_len < LBYTES)
			return (ret);
		b64_encode(&state->encoded_buff, state->hold, LBYTES);
		state->hold_len = 0;
	}

	for (; length >= LBYTES; length -= LBYTES, p += LBYTES)
		b64_encode(&state->encoded_buff, p, LBYTES);

	/* Save remaining bytes. */
	if (length > 0) {
		memcpy(state->hold, p, length);
		state->hold_len = length;
	}
	while (archive_strlen(&state->encoded_buff) >= state->bs) {
		ret = __archive_write_filter(f->next_filter,
		    state->encoded_buff.s, state->bs);
		memmove(state->encoded_buff.s,
		    state->encoded_buff.s + state->bs,
		    state->encoded_buff.length - state->bs);
		state->encoded_buff.length -= state->bs;
	}

	return (ret);
}